

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O3

int TIFFWriteDirectoryTagSampleformatArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,double *value)

{
  double dVar1;
  ushort uVar2;
  int iVar3;
  float *value_00;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  uint16_t uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  uVar9 = (ulong)count;
  value_00 = (float *)_TIFFmallocExt(tif,uVar9 * 8);
  if (value_00 == (float *)0x0) {
    TIFFErrorExtR(tif,"TIFFWriteDirectoryTagSampleformatArray","Out of memory");
    return 0;
  }
  uVar8 = (tif->tif_dir).td_sampleformat;
  if (uVar8 == 1) {
    uVar2 = (tif->tif_dir).td_bitspersample;
    if (uVar2 < 9) {
      if (count != 0) {
        uVar10 = 0;
        do {
          dVar1 = value[uVar10];
          if (0.0 <= dVar1) {
            uVar6 = (char)(int)dVar1;
            if (NAN(dVar1)) {
              uVar6 = 0xff;
            }
            uVar4 = 0xff;
            if (dVar1 <= 255.0) {
              uVar4 = uVar6;
            }
          }
          else {
            uVar4 = 0;
          }
          *(undefined1 *)((long)value_00 + uVar10) = uVar4;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (dir != (TIFFDirEntry *)0x0) {
        uVar8 = 1;
LAB_002b8f16:
        iVar3 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,uVar8,count,count,value_00);
        goto LAB_002b9128;
      }
    }
    else if (uVar2 < 0x11) {
      if (count != 0) {
        uVar10 = 0;
        do {
          dVar1 = value[uVar10];
          if (0.0 <= dVar1) {
            uVar7 = (short)(int)dVar1;
            if (NAN(dVar1)) {
              uVar7 = 0xffff;
            }
            uVar5 = 0xffff;
            if (dVar1 <= 65535.0) {
              uVar5 = uVar7;
            }
          }
          else {
            uVar5 = 0;
          }
          *(undefined2 *)((long)value_00 + uVar10 * 2) = uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (dir != (TIFFDirEntry *)0x0) {
        iVar3 = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,(uint16_t *)value_00);
        goto LAB_002b9128;
      }
    }
    else {
      if (count != 0) {
        uVar10 = 0;
        do {
          dVar1 = value[uVar10];
          fVar11 = 0.0;
          if (0.0 <= dVar1) {
            fVar11 = (float)(long)dVar1;
            if (NAN(dVar1)) {
              fVar11 = -NAN;
            }
            if (4294967295.0 < dVar1) {
              fVar11 = -NAN;
            }
          }
          value_00[uVar10] = fVar11;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (dir != (TIFFDirEntry *)0x0) {
        iVar3 = TIFFWriteDirectoryTagCheckedLongArray(tif,ndir,dir,tag,count,(uint32_t *)value_00);
        goto LAB_002b9128;
      }
    }
  }
  else {
    if (uVar8 != 2) {
      iVar3 = 0;
      if (uVar8 == 3) {
        if ((tif->tif_dir).td_bitspersample < 0x21) {
          if (count != 0) {
            uVar10 = 0;
            do {
              fVar11 = _TIFFClampDoubleToFloat(value[uVar10]);
              value_00[uVar10] = fVar11;
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
          iVar3 = TIFFWriteDirectoryTagFloatArray(tif,ndir,dir,tag,count,value_00);
        }
        else {
          iVar3 = TIFFWriteDirectoryTagDoubleArray(tif,ndir,dir,tag,count,value);
        }
      }
      goto LAB_002b9128;
    }
    uVar2 = (tif->tif_dir).td_bitspersample;
    if (uVar2 < 9) {
      if (count != 0) {
        uVar10 = 0;
        do {
          dVar1 = value[uVar10];
          uVar6 = 0x7f;
          if (dVar1 <= 127.0) {
            uVar6 = (char)(int)dVar1;
            if (NAN(dVar1)) {
              uVar6 = 0x80;
            }
            if (dVar1 < -128.0) {
              uVar6 = 0x80;
            }
          }
          *(undefined1 *)((long)value_00 + uVar10) = uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (dir != (TIFFDirEntry *)0x0) {
        uVar8 = 6;
        goto LAB_002b8f16;
      }
    }
    else {
      if (uVar2 < 0x11) {
        if (count != 0) {
          uVar10 = 0;
          do {
            dVar1 = value[uVar10];
            uVar7 = 0x7fff;
            if (dVar1 <= 32767.0) {
              uVar7 = (short)(int)dVar1;
              if (NAN(dVar1)) {
                uVar7 = 0x8000;
              }
              if (dVar1 < -32768.0) {
                uVar7 = 0x8000;
              }
            }
            *(undefined2 *)((long)value_00 + uVar10 * 2) = uVar7;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        iVar3 = TIFFWriteDirectoryTagSshortArray(tif,ndir,dir,tag,count,(int16_t *)value_00);
        goto LAB_002b9128;
      }
      if (count != 0) {
        uVar10 = 0;
        do {
          dVar1 = value[uVar10];
          fVar11 = NAN;
          if (dVar1 <= 2147483647.0) {
            fVar11 = (float)(int)dVar1;
            if (NAN(dVar1)) {
              fVar11 = -0.0;
            }
            if (dVar1 < -2147483648.0) {
              fVar11 = -0.0;
            }
          }
          value_00[uVar10] = fVar11;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (dir != (TIFFDirEntry *)0x0) {
        iVar3 = TIFFWriteDirectoryTagCheckedSlongArray(tif,ndir,dir,tag,count,(int32_t *)value_00);
        goto LAB_002b9128;
      }
    }
  }
  *ndir = *ndir + 1;
  iVar3 = 1;
LAB_002b9128:
  _TIFFfreeExt(tif,value_00);
  return iVar3;
}

Assistant:

static int TIFFWriteDirectoryTagSampleformatArray(TIFF *tif, uint32_t *ndir,
                                                  TIFFDirEntry *dir,
                                                  uint16_t tag, uint32_t count,
                                                  double *value)
{
    static const char module[] = "TIFFWriteDirectoryTagSampleformatArray";
    void *conv;
    uint32_t i;
    int ok;
    conv = _TIFFmallocExt(tif, count * sizeof(double));
    if (conv == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }

    switch (tif->tif_dir.td_sampleformat)
    {
        case SAMPLEFORMAT_IEEEFP:
            if (tif->tif_dir.td_bitspersample <= 32)
            {
                for (i = 0; i < count; ++i)
                    ((float *)conv)[i] = _TIFFClampDoubleToFloat(value[i]);
                ok = TIFFWriteDirectoryTagFloatArray(tif, ndir, dir, tag, count,
                                                     (float *)conv);
            }
            else
            {
                ok = TIFFWriteDirectoryTagDoubleArray(tif, ndir, dir, tag,
                                                      count, value);
            }
            break;
        case SAMPLEFORMAT_INT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((int8_t *)conv)[i] = TIFFClampDoubleToInt8(value[i]);
                ok = TIFFWriteDirectoryTagSbyteArray(tif, ndir, dir, tag, count,
                                                     (int8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((int16_t *)conv)[i] = TIFFClampDoubleToInt16(value[i]);
                ok = TIFFWriteDirectoryTagSshortArray(tif, ndir, dir, tag,
                                                      count, (int16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((int32_t *)conv)[i] = TIFFClampDoubleToInt32(value[i]);
                ok = TIFFWriteDirectoryTagSlongArray(tif, ndir, dir, tag, count,
                                                     (int32_t *)conv);
            }
            break;
        case SAMPLEFORMAT_UINT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((uint8_t *)conv)[i] = TIFFClampDoubleToUInt8(value[i]);
                ok = TIFFWriteDirectoryTagByteArray(tif, ndir, dir, tag, count,
                                                    (uint8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((uint16_t *)conv)[i] = TIFFClampDoubleToUInt16(value[i]);
                ok = TIFFWriteDirectoryTagShortArray(tif, ndir, dir, tag, count,
                                                     (uint16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((uint32_t *)conv)[i] = TIFFClampDoubleToUInt32(value[i]);
                ok = TIFFWriteDirectoryTagLongArray(tif, ndir, dir, tag, count,
                                                    (uint32_t *)conv);
            }
            break;
        default:
            ok = 0;
    }

    _TIFFfreeExt(tif, conv);
    return (ok);
}